

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::TestSpec::Filter::serializeTo(Filter *this,ostream *out)

{
  pointer puVar1;
  Pattern *pPVar2;
  bool bVar3;
  undefined8 in_RAX;
  unique_ptr<Catch::TestSpec::Pattern> *pattern;
  pointer puVar4;
  vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
  *__range1;
  unique_ptr<Catch::TestSpec::Pattern> *pattern_1;
  bool bVar5;
  undefined8 uStack_38;
  
  puVar4 = (this->m_required).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_required).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = puVar4 == puVar1;
  uStack_38 = in_RAX;
  if (!bVar5) {
    bVar3 = true;
    do {
      if (!bVar3) {
        uStack_38._0_7_ = CONCAT16(0x20,(undefined6)uStack_38);
        std::__ostream_insert<char,std::char_traits<char>>(out,(char *)((long)&uStack_38 + 6),1);
      }
      pPVar2 = puVar4->m_ptr;
      if (pPVar2 == (Pattern *)0x0) goto LAB_0014d996;
      (*pPVar2->_vptr_Pattern[3])(pPVar2,out);
      puVar4 = puVar4 + 1;
      bVar3 = false;
    } while (puVar4 != puVar1);
  }
  puVar4 = (this->m_forbidden).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_forbidden).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 != puVar1) {
    do {
      if (!bVar5) {
        uStack_38 = CONCAT17(0x20,(undefined7)uStack_38);
        std::__ostream_insert<char,std::char_traits<char>>(out,(char *)((long)&uStack_38 + 7),1);
      }
      pPVar2 = puVar4->m_ptr;
      if (pPVar2 == (Pattern *)0x0) {
LAB_0014d996:
        __assert_fail("m_ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                      ,0x381,
                      "const T &Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>::operator*() const [T = Catch::TestSpec::Pattern]"
                     );
      }
      (*pPVar2->_vptr_Pattern[3])(pPVar2,out);
      puVar4 = puVar4 + 1;
      bVar5 = false;
    } while (puVar4 != puVar1);
  }
  return;
}

Assistant:

void TestSpec::Filter::serializeTo( std::ostream& out ) const {
        bool first = true;
        for ( auto const& pattern : m_required ) {
            if ( !first ) {
                out << ' ';
            }
            out << *pattern;
            first = false;
        }
        for ( auto const& pattern : m_forbidden ) {
            if ( !first ) {
                out << ' ';
            }
            out << *pattern;
            first = false;
        }
    }